

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadStringSize(ON_BinaryArchive *this,size_t *sizeof_string)

{
  ON_3DM_BIG_CHUNK *pOVar1;
  ON_3DM_BIG_CHUNK *curchunk;
  bool rc;
  size_t *psStack_18;
  ON__UINT32 ui32;
  size_t *sizeof_string_local;
  ON_BinaryArchive *this_local;
  
  curchunk._4_4_ = 0;
  psStack_18 = sizeof_string;
  sizeof_string_local = (size_t *)this;
  curchunk._3_1_ = ReadInt32(this,1,(ON__INT32 *)((long)&curchunk + 4));
  if ((bool)curchunk._3_1_) {
    if ((curchunk._4_4_ & 0xf000000) == 0) {
      if ((((curchunk._4_4_ != 0) &&
           (pOVar1 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk),
           pOVar1 != (ON_3DM_BIG_CHUNK *)0x0)) && ((pOVar1->m_typecode & 0x80000000) == 0)) &&
         ((pOVar1->m_big_value < 0 || (pOVar1->m_big_value < (long)(ulong)curchunk._4_4_)))) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x604,"","string element count exceeds current chunk size");
        curchunk._3_1_ = 0;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x5f7,"","string element count is impossibly large");
      curchunk._3_1_ = 0;
    }
    if ((curchunk._3_1_ & 1) != 0) {
      *psStack_18 = (ulong)curchunk._4_4_;
    }
  }
  return (bool)(curchunk._3_1_ & 1);
}

Assistant:

bool
ON_BinaryArchive::ReadStringSize( // Read size of nullptr terminated string
    size_t* sizeof_string          // (returned size includes nullptr terminator)
    )
{
  ON__UINT32 ui32 = 0;
  bool rc = ReadInt32(1,(ON__INT32*)&ui32);
  // Note that ui32 = number of elements in the string array, including
  // the null terminator.  So ui32 should either be 0 or be >= 2.
  // The string array elements can be chars or unsigned shorts;
  // therefore the number of bytes in the string cannot be determined
  // at this point because we don't know what type of string is
  // being read.
  if (rc)
  {
    // 8 October 2004 Dale Lear
    //    Added the sanity checks on string size to avoid attempts
    //    to allocate huge amounts of memory when the value
    //    comes from a damaged file.
    if ( 0 != (0xF000000 & ui32) )
    {
      // 268 million chars oughta be plenty
      ON_ERROR("string element count is impossibly large");
      rc = false;
    }
    else if ( ui32 > 0 )
    {
      // make sure this is possible
      const ON_3DM_BIG_CHUNK* curchunk = m_chunk.Last();
      if ( 0 != curchunk && 0 == (TCODE_SHORT & curchunk->m_typecode) )
      {
        if (    curchunk->m_big_value < 0 
             || ((ON__INT64)ui32) > curchunk->m_big_value 
           )
        {
          ON_ERROR("string element count exceeds current chunk size");
          rc = false;
        }
      }
    }

    if (rc)
    {
      *sizeof_string = (size_t)ui32;
    }
  }
  return rc;
}